

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op.c
# Opt level: O2

void tcg_gen_andi_i64_mips(TCGContext_conflict3 *tcg_ctx,TCGv_i64 ret,TCGv_i64 arg1,int64_t arg2)

{
  TCGOpcode opc;
  TCGOp *pTVar1;
  TCGv_i64 arg2_00;
  uintptr_t o_3;
  uintptr_t o;
  
  if (arg2 == -1) {
    tcg_gen_mov_i64_mips(tcg_ctx,ret,arg1);
    return;
  }
  if (arg2 == 0xffffffff) {
    opc = INDEX_op_ext32u_i64;
  }
  else if (arg2 == 0xff) {
    opc = INDEX_op_ext8u_i64;
  }
  else {
    if (arg2 != 0xffff) {
      if (arg2 == 0) {
        tcg_gen_movi_i64_mips(tcg_ctx,ret,0);
        return;
      }
      arg2_00 = tcg_const_i64_mips(tcg_ctx,arg2);
      tcg_gen_and_i64_mips(tcg_ctx,ret,arg1,arg2_00);
      tcg_temp_free_internal_mips(tcg_ctx,(TCGTemp *)(arg2_00 + (long)tcg_ctx));
      return;
    }
    opc = INDEX_op_ext16u_i64;
  }
  pTVar1 = tcg_emit_op_mips(tcg_ctx,opc);
  pTVar1->args[0] = (TCGArg)(ret + (long)tcg_ctx);
  pTVar1->args[1] = (TCGArg)(arg1 + (long)tcg_ctx);
  return;
}

Assistant:

void tcg_gen_andi_i64(TCGContext *tcg_ctx, TCGv_i64 ret, TCGv_i64 arg1, int64_t arg2)
{
#if TCG_TARGET_REG_BITS == 32
        tcg_gen_andi_i32(tcg_ctx, TCGV_LOW(tcg_ctx, ret), TCGV_LOW(tcg_ctx, arg1), arg2);
        tcg_gen_andi_i32(tcg_ctx, TCGV_HIGH(tcg_ctx, ret), TCGV_HIGH(tcg_ctx, arg1), arg2 >> 32);
        return;
#else
    TCGv_i64 t0;

    /* Some cases can be optimized here.  */
    switch (arg2) {
    case 0:
        tcg_gen_movi_i64(tcg_ctx, ret, 0);
        return;
    case -1:
        tcg_gen_mov_i64(tcg_ctx, ret, arg1);
        return;
    case 0xff:
        /* Don't recurse with tcg_gen_ext8u_i64.  */
        if (TCG_TARGET_HAS_ext8u_i64) {
            tcg_gen_op2_i64(tcg_ctx, INDEX_op_ext8u_i64, ret, arg1);
            return;
        }
        break;
    case 0xffff:
        if (TCG_TARGET_HAS_ext16u_i64) {
            tcg_gen_op2_i64(tcg_ctx, INDEX_op_ext16u_i64, ret, arg1);
            return;
        }
        break;
    case 0xffffffffu:
        if (TCG_TARGET_HAS_ext32u_i64) {
            tcg_gen_op2_i64(tcg_ctx, INDEX_op_ext32u_i64, ret, arg1);
            return;
        }
        break;
    }
    t0 = tcg_const_i64(tcg_ctx, arg2);
    tcg_gen_and_i64(tcg_ctx, ret, arg1, t0);
    tcg_temp_free_i64(tcg_ctx, t0);
#endif
}